

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O2

uint8_t * __thiscall jrtplib::RTCPSDESPacket::GetItemData(RTCPSDESPacket *this)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  
  if (((this->super_RTCPPacket).knownformat == true) && (this->currentchunk != (uint8_t *)0x0)) {
    puVar2 = this->currentchunk + this->itemoffset;
    puVar1 = (uint8_t *)0x0;
    if (*puVar2 != '\0') {
      puVar1 = puVar2 + 2;
    }
    return puVar1;
  }
  return (uint8_t *)0x0;
}

Assistant:

inline uint8_t *RTCPSDESPacket::GetItemData()
{
	if (!knownformat)
		return 0;
	if (currentchunk == 0)
		return 0;
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+itemoffset);
	if (sdeshdr->sdesid == 0)
		return 0;
	return (currentchunk+itemoffset+sizeof(RTCPSDESHeader));
}